

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O1

bool __thiscall Builder::Build(Builder *this,string *err)

{
  BuildConfig *pBVar1;
  CommandRunner *pCVar2;
  BuildStatus *pBVar3;
  const_iterator __position;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  CommandRunner *pCVar8;
  uint64_t uVar9;
  char *pcVar10;
  int iVar11;
  int iVar12;
  Edge *edge;
  int iVar13;
  Result result;
  Result local_70;
  Plan *local_40;
  _Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>> *local_38;
  
  if (((this->plan_).wanted_edges_ < 1) || ((this->plan_).command_edges_ < 1)) {
    __assert_fail("!AlreadyUpToDate()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build.cc"
                  ,0x325,"bool Builder::Build(string *)");
  }
  this->status_->total_edges_ = (this->plan_).command_edges_;
  pBVar1 = this->config_;
  iVar11 = *(int *)(pBVar1 + 0xc);
  if ((this->command_runner_)._M_t.
      super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
      super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl == (CommandRunner *)0x0) {
    if (pBVar1[4] == (BuildConfig)0x1) {
      pCVar8 = (CommandRunner *)operator_new(0x58);
      pCVar8->_vptr_CommandRunner = (_func_int **)&PTR__DryRunCommandRunner_0012cba0;
      pCVar8[1]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar8[2]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar8[3]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar8[4]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar8[5]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar8[6]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar8[7]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar8[8]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar8[9]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar8[10]._vptr_CommandRunner = (_func_int **)0x0;
      std::_Deque_base<Edge_*,_std::allocator<Edge_*>_>::_M_initialize_map
                ((_Deque_base<Edge_*,_std::allocator<Edge_*>_> *)(pCVar8 + 1),0);
    }
    else {
      pCVar8 = (CommandRunner *)operator_new(0x2f0);
      pCVar8->_vptr_CommandRunner = (_func_int **)&PTR__RealCommandRunner_0012cb40;
      pCVar8[1]._vptr_CommandRunner = (_func_int **)pBVar1;
      SubprocessSet::SubprocessSet((SubprocessSet *)(pCVar8 + 2));
      *(undefined4 *)&pCVar8[0x59]._vptr_CommandRunner = 0;
      pCVar8[0x5a]._vptr_CommandRunner = (_func_int **)0x0;
      pCVar8[0x5b]._vptr_CommandRunner = (_func_int **)(pCVar8 + 0x59);
      pCVar8[0x5c]._vptr_CommandRunner = (_func_int **)(pCVar8 + 0x59);
      pCVar8[0x5d]._vptr_CommandRunner = (_func_int **)0x0;
    }
    pCVar2 = (this->command_runner_)._M_t.
             super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
             super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
             super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
    (this->command_runner_)._M_t.
    super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
    super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
    super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl = pCVar8;
    if (pCVar2 != (CommandRunner *)0x0) {
      (*pCVar2->_vptr_CommandRunner[1])();
    }
  }
  local_40 = &this->plan_;
  pBVar3 = this->status_;
  uVar9 = Stopwatch::Now(&(pBVar3->overall_rate_).stopwatch_);
  (pBVar3->overall_rate_).stopwatch_.started_ = uVar9;
  uVar9 = Stopwatch::Now(&(pBVar3->current_rate_).stopwatch_);
  (pBVar3->current_rate_).stopwatch_.started_ = uVar9;
  local_38 = (_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>> *)
             &(this->plan_).ready_;
  iVar7 = 0;
  iVar12 = 0;
LAB_0010984c:
  do {
    bVar4 = (this->plan_).command_edges_ < 1 || (this->plan_).wanted_edges_ < 1;
    if (bVar4) {
      BuildStatus::BuildFinished(this->status_);
      return bVar4;
    }
    iVar13 = iVar12;
    if ((iVar11 != 0) &&
       (iVar6 = (*((this->command_runner_)._M_t.
                   super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                   super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                   super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl)->_vptr_CommandRunner
                  [2])(), iVar13 = iVar7, (char)iVar6 != '\0')) {
      if ((this->plan_).ready_._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        edge = (Edge *)0x0;
      }
      else {
        __position._M_node =
             (this->plan_).ready_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        edge = *(Edge **)(__position._M_node + 1);
        std::_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>>::
        erase_abi_cxx11_(local_38,__position);
      }
      if (edge == (Edge *)0x0) {
        iVar6 = 0;
      }
      else {
        bVar5 = StartEdge(this,edge,err);
        if (bVar5) {
          bVar5 = Edge::is_phony(edge);
          if (bVar5) {
            bVar5 = Plan::EdgeFinished(local_40,edge,kEdgeSucceeded,err);
            iVar6 = 2;
            if (!bVar5) goto LAB_001098e4;
          }
          else {
            iVar6 = 2;
            iVar13 = iVar7 + 1;
          }
        }
        else {
LAB_001098e4:
          Cleanup(this);
          BuildStatus::BuildFinished(this->status_);
          iVar6 = 1;
        }
      }
      iVar7 = iVar13;
      if (iVar6 == 2) goto LAB_0010984c;
      if (iVar6 != 0) {
        return bVar4;
      }
    }
    if (iVar13 == 0) {
      BuildStatus::BuildFinished(this->status_);
      if (iVar11 == 0) {
        if (*(int *)(this->config_ + 0xc) < 2) {
          pcVar10 = "subcommand failed";
        }
        else {
          pcVar10 = "subcommands failed";
        }
      }
      else if (iVar11 < *(int *)(this->config_ + 0xc)) {
        pcVar10 = "cannot make progress due to previous errors";
      }
      else {
        pcVar10 = "stuck [this is a bug]";
      }
      std::__cxx11::string::_M_replace((ulong)err,0,(char *)err->_M_string_length,(ulong)pcVar10);
      return bVar4;
    }
    local_70.edge = (Edge *)0x0;
    local_70.output._M_dataplus._M_p = (pointer)&local_70.output.field_2;
    local_70.output._M_string_length = 0;
    local_70.output.field_2._M_local_buf[0] = '\0';
    iVar7 = (*((this->command_runner_)._M_t.
               super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
               super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
               super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl)->_vptr_CommandRunner[4])
                      ();
    if (((byte)iVar7 & local_70.status != ExitInterrupted) == 0) {
      Cleanup(this);
      BuildStatus::BuildFinished(this->status_);
      bVar5 = false;
      std::__cxx11::string::_M_replace((ulong)err,0,(char *)err->_M_string_length,0x120628);
    }
    else {
      bVar5 = FinishCommand(this,&local_70,err);
      iVar13 = iVar13 + -1;
      if (!bVar5) {
        Cleanup(this);
        BuildStatus::BuildFinished(this->status_);
      }
      else {
        iVar11 = iVar11 - (uint)(local_70.status != ExitSuccess && iVar11 != 0);
      }
      bVar5 = bVar5;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.output._M_dataplus._M_p != &local_70.output.field_2) {
      operator_delete(local_70.output._M_dataplus._M_p,
                      CONCAT71(local_70.output.field_2._M_allocated_capacity._1_7_,
                               local_70.output.field_2._M_local_buf[0]) + 1);
    }
    iVar7 = iVar13;
    iVar12 = iVar13;
    if (!bVar5) {
      return bVar4;
    }
  } while( true );
}

Assistant:

bool Builder::Build(string* err) {
  assert(!AlreadyUpToDate());

  status_->PlanHasTotalEdges(plan_.command_edge_count());
  int pending_commands = 0;
  int failures_allowed = config_.failures_allowed;

  // Set up the command runner if we haven't done so already.
  if (!command_runner_.get()) {
    if (config_.dry_run)
      command_runner_.reset(new DryRunCommandRunner);
    else
      command_runner_.reset(new RealCommandRunner(config_));
  }

  // We are about to start the build process.
  status_->BuildStarted();

  // This main loop runs the entire build process.
  // It is structured like this:
  // First, we attempt to start as many commands as allowed by the
  // command runner.
  // Second, we attempt to wait for / reap the next finished command.
  while (plan_.more_to_do()) {
    // See if we can start any more commands.
    if (failures_allowed && command_runner_->CanRunMore()) {
      if (Edge* edge = plan_.FindWork()) {
        if (!StartEdge(edge, err)) {
          Cleanup();
          status_->BuildFinished();
          return false;
        }

        if (edge->is_phony()) {
          if (!plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, err)) {
            Cleanup();
            status_->BuildFinished();
            return false;
          }
        } else {
          ++pending_commands;
        }

        // We made some progress; go back to the main loop.
        continue;
      }
    }

    // See if we can reap any finished commands.
    if (pending_commands) {
      CommandRunner::Result result;
      if (!command_runner_->WaitForCommand(&result) ||
          result.status == ExitInterrupted) {
        Cleanup();
        status_->BuildFinished();
        *err = "interrupted by user";
        return false;
      }

      --pending_commands;
      if (!FinishCommand(&result, err)) {
        Cleanup();
        status_->BuildFinished();
        return false;
      }

      if (!result.success()) {
        if (failures_allowed)
          failures_allowed--;
      }

      // We made some progress; start the main loop over.
      continue;
    }

    // If we get here, we cannot make any more progress.
    status_->BuildFinished();
    if (failures_allowed == 0) {
      if (config_.failures_allowed > 1)
        *err = "subcommands failed";
      else
        *err = "subcommand failed";
    } else if (failures_allowed < config_.failures_allowed)
      *err = "cannot make progress due to previous errors";
    else
      *err = "stuck [this is a bug]";

    return false;
  }

  status_->BuildFinished();
  return true;
}